

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O3

uint32_t * FastPForLib::__fastpackwithoutmask26_16(uint32_t *in,uint32_t *out)

{
  undefined1 auVar1 [16];
  uint uVar2;
  uint uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [16];
  undefined8 uVar13;
  
  auVar1 = *(undefined1 (*) [16])(in + 1);
  auVar12 = vpmovsxbd_avx(ZEXT416(0x120c06));
  uVar2 = in[0xe];
  auVar6 = vpinsrd_avx(auVar12,(uint)*(byte *)((long)in + 0x13),3);
  auVar7 = vpinsrd_avx(auVar1,in[5] << 2,3);
  auVar12 = vpsrlvd_avx2(auVar1,auVar12);
  uVar3 = in[9];
  auVar6 = vpor_avx(auVar7,auVar6);
  auVar6 = vpblendd_avx2(auVar12,auVar6,8);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(in + 7);
  auVar7 = vpsrlvd_avx2(auVar12,_DAT_001ad700);
  auVar9 = valignd_avx512vl(ZEXT1632(auVar6),ZEXT1632(auVar6),7);
  auVar10 = vpbroadcastd_avx512vl();
  auVar10 = vpblendd_avx2(ZEXT1632(auVar1),auVar10,0x10);
  auVar1 = vpshufd_avx(auVar12,0x50);
  auVar11._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar10._0_16_;
  auVar11._16_16_ = ZEXT116(0) * auVar10._16_16_ + ZEXT116(1) * auVar1;
  auVar10 = vpblendd_avx2(auVar10,auVar11,0x60);
  auVar11 = vpbroadcastd_avx512vl();
  auVar10 = vpblendd_avx2(auVar10,auVar11,0x80);
  auVar11 = vpsllvd_avx2(auVar10,_DAT_001ae580);
  auVar10 = vpblendd_avx2(auVar9,ZEXT432(*in),1);
  auVar9 = vpbroadcastd_avx512vl();
  uVar4 = in[10];
  auVar10 = vpblendd_avx2(auVar10,auVar9,0x20);
  uVar13 = auVar7._0_8_;
  auVar9._8_8_ = uVar13;
  auVar9._0_8_ = uVar13;
  auVar9._16_8_ = uVar13;
  auVar9._24_8_ = uVar13;
  auVar7 = vpmovsxbd_avx(ZEXT416(0xe080200));
  auVar10 = vpblendd_avx2(auVar10,auVar9,0xc0);
  auVar10 = vpor_avx2(auVar11,auVar10);
  *(undefined1 (*) [32])out = auVar10;
  auVar1 = vpinsrd_avx(auVar7,uVar3 >> 0x16,0);
  uVar5 = in[0xf];
  auVar12 = vpshufd_avx(*(undefined1 (*) [16])(in + 0xb),0x90);
  auVar8 = vpsllvd_avx2(*(undefined1 (*) [16])(in + 0xb),_DAT_001a1ad0);
  auVar6 = vpinsrd_avx(auVar12,uVar4 << 4,0);
  auVar7 = vpsrlvd_avx2(auVar12,auVar7);
  auVar1 = vpor_avx(auVar6,auVar1);
  auVar1 = vpblendd_avx2(auVar7,auVar1,1);
  auVar1 = vpor_avx(auVar8,auVar1);
  *(undefined1 (*) [16])(out + 8) = auVar1;
  out[0xc] = uVar5 << 6 | uVar2 >> 0x14;
  return out + 0xd;
}

Assistant:

uint32_t *__fastpackwithoutmask26_16(const uint32_t *__restrict__ in,
                                     uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 26;
  ++out;
  *out = ((*in)) >> (26 - 20);
  ++in;
  *out |= ((*in)) << 20;
  ++out;
  *out = ((*in)) >> (26 - 14);
  ++in;
  *out |= ((*in)) << 14;
  ++out;
  *out = ((*in)) >> (26 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++out;
  *out = ((*in)) >> (26 - 2);
  ++in;
  *out |= ((*in)) << 2;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (26 - 22);
  ++in;
  *out |= ((*in)) << 22;
  ++out;
  *out = ((*in)) >> (26 - 16);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  *out = ((*in)) >> (26 - 10);
  ++in;
  *out |= ((*in)) << 10;
  ++out;
  *out = ((*in)) >> (26 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 30;
  ++out;
  *out = ((*in)) >> (26 - 24);
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (26 - 18);
  ++in;
  *out |= ((*in)) << 18;
  ++out;
  *out = ((*in)) >> (26 - 12);
  ++in;
  *out |= ((*in)) << 12;
  ++out;
  *out = ((*in)) >> (26 - 6);
  ++in;
  *out |= ((*in)) << 6;
  ++out;
  ++in;

  return out;
}